

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O2

int have_flag(int argc,char **argv,char *flag)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 8;
  do {
    if ((long)argc * 8 == lVar2) {
      return 0;
    }
    iVar1 = strcmp(*(char **)((long)argv + lVar2),flag);
    lVar2 = lVar2 + 8;
  } while (iVar1 != 0);
  return 1;
}

Assistant:

static int have_flag(int argc, char** argv, char *flag) {
    char** argm = argv + argc;
    argv++;
    while (argv != argm) {
        if (strcmp(*argv, flag) == 0) {
            return 1;
        }
        argv++;
    }
    return 0;
}